

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::NegativeGLSLCompileTime::Compile
          (NegativeGLSLCompileTime *this,string *source)

{
  GLuint shader;
  int local_44c;
  GLchar local_448 [4];
  GLint status;
  GLchar log [1024];
  char *pcStack_38;
  GLuint sh;
  char *src [2];
  char *csVer;
  string *source_local;
  NegativeGLSLCompileTime *this_local;
  
  src[1] = "#version 430 core";
  pcStack_38 = "#version 430 core";
  src[0] = (char *)std::__cxx11::string::c_str();
  shader = glu::CallLogWrapper::glCreateShader
                     (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper
                       .super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,shader,2,&stack0xffffffffffffffc8,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,shader);
  glu::CallLogWrapper::glGetShaderInfoLog
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,shader,0x400,(GLsizei *)0x0,local_448);
  anon_unknown_0::Output("Shader Info Log:\n%s\n",local_448);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,shader,0x8b81,&local_44c);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,shader);
  if (local_44c == 1) {
    anon_unknown_0::Output("Compilation should fail.\n");
  }
  return local_44c != 1;
}

Assistant:

bool Compile(const std::string& source)
	{
		const char* const csVer  = "#version 430 core";
		const char* const src[2] = { csVer, source.c_str() };
		const GLuint	  sh	 = glCreateShader(GL_FRAGMENT_SHADER);
		glShaderSource(sh, 2, src, NULL);
		glCompileShader(sh);

		GLchar log[1024];
		glGetShaderInfoLog(sh, sizeof(log), NULL, log);
		Output("Shader Info Log:\n%s\n", log);

		GLint status;
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
		glDeleteShader(sh);

		if (status == GL_TRUE)
		{
			Output("Compilation should fail.\n");
			return false;
		}

		return true;
	}